

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  xml_output local_150;
  xml_output local_118;
  xml_output local_e0;
  xml_output local_a8;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x48) != 0) {
    tag(&local_70,(QString *)__buf);
    pXVar1 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
    attrS(&local_a8,"RemoteDirectory",(QString *)((long)__buf + 0x18));
    pXVar1 = XmlOutput::operator<<(pXVar1,&local_a8);
    attrE(&local_e0,"RegisterOutput",*(int *)((long)__buf + 0x30));
    pXVar1 = XmlOutput::operator<<(pXVar1,&local_e0);
    attrS(&local_118,"AdditionalFiles",(QString *)((long)__buf + 0x38));
    pXVar1 = XmlOutput::operator<<(pXVar1,&local_118);
    closetag(&local_150,(QString *)__buf);
    XmlOutput::operator<<(pXVar1,&local_150);
    XmlOutput::xml_output::~xml_output(&local_150);
    XmlOutput::xml_output::~xml_output(&local_118);
    XmlOutput::xml_output::~xml_output(&local_e0);
    XmlOutput::xml_output::~xml_output(&local_a8);
    XmlOutput::xml_output::~xml_output(&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCDeploymentTool &tool)
{
    if (tool.AdditionalFiles.isEmpty())
        return;
    xml << tag(tool.DeploymentTag)
        << attrS(_RemoteDirectory, tool.RemoteDirectory)
        << attrE(_RegisterOutput, tool.RegisterOutput)
        << attrS(_AdditionalFiles, tool.AdditionalFiles)
        << closetag(tool.DeploymentTag);
}